

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveTree.cpp
# Opt level: O1

void glslang::RemoveAllTreeNodes(TIntermNode *root)

{
  TRemoveTraverser it;
  undefined **local_50;
  undefined2 local_48;
  undefined1 local_46;
  undefined8 local_45;
  undefined1 local_3d;
  TPoolAllocator *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_50 = &PTR__TIntermTraverser_00b096d8;
  local_48 = 0;
  local_46 = 1;
  local_38 = (TPoolAllocator *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_45 = 0;
  local_3d = 0;
  local_38 = GetThreadPoolAllocator();
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_50 = &PTR__TIntermTraverser_00b10c30;
  (*root->_vptr_TIntermNode[2])(root,&local_50);
  return;
}

Assistant:

void RemoveAllTreeNodes(TIntermNode* root)
{
    TRemoveTraverser it;

    root->traverse(&it);
}